

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O0

c8 * __thiscall
irr::scene::COBJMeshFileLoader::readVec3
          (COBJMeshFileLoader *this,c8 *bufPtr,vector3df *vec,c8 *bufEnd)

{
  c8 *pcVar1;
  float *in_RDX;
  c8 *in_RDI;
  float fVar2;
  c8 wordBuffer [256];
  u32 WORD_BUFFER_LENGTH;
  char **in_stack_fffffffffffffec8;
  u32 in_stack_fffffffffffffedc;
  c8 *in_stack_fffffffffffffee0;
  c8 *in_stack_fffffffffffffee8;
  COBJMeshFileLoader *in_stack_fffffffffffffef0;
  
  goAndCopyNextWord(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffedc,in_RDI);
  fVar2 = core::fast_atof(in_RDI,in_stack_fffffffffffffec8);
  *in_RDX = -fVar2;
  goAndCopyNextWord(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffedc,in_RDI);
  fVar2 = core::fast_atof(in_RDI,in_stack_fffffffffffffec8);
  in_RDX[1] = fVar2;
  pcVar1 = goAndCopyNextWord(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_RDI);
  fVar2 = core::fast_atof(in_RDI,in_stack_fffffffffffffec8);
  in_RDX[2] = fVar2;
  return pcVar1;
}

Assistant:

const c8 *COBJMeshFileLoader::readVec3(const c8 *bufPtr, core::vector3df &vec, const c8 *const bufEnd)
{
	const u32 WORD_BUFFER_LENGTH = 256;
	c8 wordBuffer[WORD_BUFFER_LENGTH];

	bufPtr = goAndCopyNextWord(wordBuffer, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
	vec.X = -core::fast_atof(wordBuffer); // change handedness
	bufPtr = goAndCopyNextWord(wordBuffer, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
	vec.Y = core::fast_atof(wordBuffer);
	bufPtr = goAndCopyNextWord(wordBuffer, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
	vec.Z = core::fast_atof(wordBuffer);
	return bufPtr;
}